

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall FileEntryInfo::serializeDir(FileEntryInfo *this)

{
  uint8_t objectId;
  FileTypes fileType;
  int iVar1;
  IsoWriter *this_00;
  bool bVar2;
  int32_t iVar3;
  reference ppFVar4;
  int64_t iVar5;
  uint64_t len;
  size_type sVar6;
  uint32_t local_890;
  uint32_t local_88c;
  FileEntryInfo **i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1_1;
  FileEntryInfo **i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1;
  undefined1 local_838 [7];
  uint8_t parentId;
  ByteFileWriter writer;
  uint8_t buffer [2048];
  FileEntryInfo *this_local;
  
  memset(&writer.m_tagPos,0,0x800);
  ByteFileWriter::ByteFileWriter((ByteFileWriter *)local_838);
  ByteFileWriter::setBuffer((ByteFileWriter *)local_838,(uint8_t *)&writer.m_tagPos,0x800);
  iVar3 = IsoWriter::absoluteSectorNum(this->m_owner);
  ByteFileWriter::writeDescriptorTag((ByteFileWriter *)local_838,FileId,iVar3 + 1);
  ByteFileWriter::writeLE16((ByteFileWriter *)local_838,1);
  ByteFileWriter::writeLE8((ByteFileWriter *)local_838,'\n');
  ByteFileWriter::writeLE8((ByteFileWriter *)local_838,'\0');
  if (this->m_parent == (FileEntryInfo *)0x0) {
    local_88c = 0;
  }
  else {
    local_88c = (uint32_t)this->m_parent->m_objectId;
  }
  if (this->m_parent == (FileEntryInfo *)0x0) {
    local_890 = IsoWriter::absoluteSectorNum(this->m_owner);
  }
  else {
    local_890 = this->m_parent->m_sectorNum;
  }
  ByteFileWriter::writeLongAD((ByteFileWriter *)local_838,0x800,local_890,1,local_88c);
  ByteFileWriter::writeLE16((ByteFileWriter *)local_838,0);
  ByteFileWriter::writeLE16((ByteFileWriter *)local_838,0);
  ByteFileWriter::closeDescriptorTag((ByteFileWriter *)local_838,-1);
  __end1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin(&this->m_files);
  i = (FileEntryInfo **)
      std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(&this->m_files);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                                *)&i);
    if (!bVar2) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1);
    writeEntity(this,(ByteFileWriter *)local_838,*ppFVar4);
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin(&this->m_subDirs)
  ;
  i_1 = (FileEntryInfo **)
        std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(&this->m_subDirs);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                        *)&i_1);
    if (!bVar2) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1_1);
    writeEntity(this,(ByteFileWriter *)local_838,*ppFVar4);
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1_1);
  }
  iVar5 = ByteFileWriter::size((ByteFileWriter *)local_838);
  if (iVar5 < 0x800) {
    this_00 = this->m_owner;
    objectId = this->m_objectId;
    fileType = this->m_fileType;
    len = ByteFileWriter::size((ByteFileWriter *)local_838);
    iVar1 = this->m_sectorNum;
    sVar6 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::size(&this->m_subDirs);
    IsoWriter::writeExtendedFileEntryDescriptor
              (this_00,false,objectId,fileType,len,iVar1 + 1,(short)sVar6 + 1,(ExtentList *)0x0);
    IsoWriter::writeSector(this->m_owner,(uint8_t *)&writer.m_tagPos);
    return;
  }
  __assert_fail("writer.size() < SECTOR_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                ,0x1a8,"void FileEntryInfo::serializeDir() const");
}

Assistant:

void FileEntryInfo::serializeDir() const
{
    uint8_t buffer[SECTOR_SIZE] = {};

    ByteFileWriter writer;
    writer.setBuffer(buffer, sizeof(buffer));

    // ------------ 1 (parent entry) ---------------

    writer.writeDescriptorTag(DescriptorTag::FileId, m_owner->absoluteSectorNum() + 1);
    writer.writeLE16(0x01);  // File Version Number
    writer.writeLE8(0x0A);   // File Characteristics, parent flag (3-th bit) and  'directory' bit (1-th)
    writer.writeLE8(0x00);   // Length of File Identifier (=L_FI)

    const uint8_t parentId = m_parent ? m_parent->m_objectId : 0;
    writer.writeLongAD(0x800, m_parent ? m_parent->m_sectorNum : m_owner->absoluteSectorNum(), 0x01,
                       parentId);  // parent entry ICB
    writer.writeLE16(0);           // Length of Implementation Use
    writer.writeLE16(0);           // zero d-string for parent FID
    writer.closeDescriptorTag();

    // ------------ 2 (entries) ---------------
    for (const auto &i : m_files) writeEntity(writer, i);
    for (const auto &i : m_subDirs) writeEntity(writer, i);
    assert(writer.size() < SECTOR_SIZE);  // not supported

    m_owner->writeExtendedFileEntryDescriptor(false, m_objectId, m_fileType, writer.size(), m_sectorNum + 1,
                                              static_cast<uint16_t>(m_subDirs.size() + 1));
    m_owner->writeSector(buffer);
}